

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResultModel.cpp
# Opt level: O2

QSize __thiscall ResultModel::span(ResultModel *this,QModelIndex *index)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  const_reference pDVar4;
  const_reference s1;
  const_reference s2;
  ulong uVar5;
  ulong uVar6;
  long i;
  
  uVar5 = 0xffffffff00000000;
  uVar6 = 0xffffffff;
  bVar2 = QModelIndex::isValid(index);
  if (bVar2) {
    iVar1 = index->r;
    i = (long)index->c;
    if (i == 1) {
      pDVar4 = QList<ResultModel::Data>::at(&this->m_data,(long)iVar1);
      if (pDVar4->merged != false) {
        uVar5 = 0x100000000;
        uVar6 = 2;
        goto LAB_00108f1b;
      }
    }
    iVar3 = (**(code **)(*(long *)this + 0x78))(this);
    if (iVar1 < iVar3 + -1) {
      pDVar4 = QList<ResultModel::Data>::at(&this->m_data,(long)iVar1);
      s1 = QList<QString>::at(&pDVar4->list,i);
      pDVar4 = QList<ResultModel::Data>::at(&this->m_data,(long)(iVar1 + 1));
      s2 = QList<QString>::at(&pDVar4->list,i);
      bVar2 = operator==(s1,s2);
      if (bVar2) {
        uVar6 = 1;
        uVar5 = 0x200000000;
      }
    }
  }
LAB_00108f1b:
  return (QSize)(uVar5 | uVar6);
}

Assistant:

QSize ResultModel::span(const QModelIndex &index) const
{
    if (!index.isValid())
        return QSize();

    const int row = index.row();
    const int column = index.column();

    if (column == 1 && m_data[row].merged)
        return QSize(2, 1);

    if (row < rowCount() - 1 && m_data[row].list.at(column) == m_data[row + 1].list.at(column))
        return QSize(1, 2);

    return QSize();
}